

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

NETRCcode Curl_parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,
                         char *netrcfile)

{
  NETRCcode NVar1;
  __uid_t __uid;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  passwd *pw_res;
  passwd pw;
  char pwbuf [1024];
  
  if (netrcfile != (char *)0x0) {
    NVar1 = parsenetrc(store,host,loginp,passwordp,netrcfile);
    return NVar1;
  }
  pcVar3 = curl_getenv("HOME");
  pcVar4 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    __uid = geteuid();
    iVar2 = getpwuid_r(__uid,(passwd *)&pw,pwbuf,0x400,(passwd **)&pw_res);
    pcVar4 = pw.pw_dir;
    if ((pw.pw_dir == (char *)0x0 || pw_res == (passwd *)0x0) || iVar2 != 0) {
      return NETRC_FILE_MISSING;
    }
  }
  pcVar4 = curl_maprintf("%s%s.netrc",pcVar4,"/");
  if (pcVar4 == (char *)0x0) {
    (*Curl_cfree)(pcVar3);
    NVar1 = NETRC_OUT_OF_MEMORY;
  }
  else {
    NVar1 = parsenetrc(store,host,loginp,passwordp,pcVar4);
    (*Curl_cfree)(pcVar4);
    (*Curl_cfree)(pcVar3);
  }
  return NVar1;
}

Assistant:

NETRCcode Curl_parsenetrc(struct store_netrc *store, const char *host,
                          char **loginp, char **passwordp,
                          char *netrcfile)
{
  NETRCcode retcode = NETRC_OK;
  char *filealloc = NULL;

  if(!netrcfile) {
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    char pwbuf[1024];
#endif
    char *home = NULL;
    char *homea = curl_getenv("HOME"); /* portable environment reader */
    if(homea) {
      home = homea;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = pw.pw_dir;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#elif defined(_WIN32)
    }
    else {
      homea = curl_getenv("USERPROFILE");
      if(homea) {
        home = homea;
      }
#endif
    }

    if(!home)
      return NETRC_FILE_MISSING; /* no home directory found (or possibly out
                                    of memory) */

    filealloc = aprintf("%s%s.netrc", home, DIR_CHAR);
    if(!filealloc) {
      free(homea);
      return NETRC_OUT_OF_MEMORY;
    }
    retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
    free(filealloc);
#ifdef _WIN32
    if(retcode == NETRC_FILE_MISSING) {
      /* fallback to the old-style "_netrc" file */
      filealloc = aprintf("%s%s_netrc", home, DIR_CHAR);
      if(!filealloc) {
        free(homea);
        return NETRC_OUT_OF_MEMORY;
      }
      retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
      free(filealloc);
    }
#endif
    free(homea);
  }